

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint32_t tail32_le(void *v,size_t tail)

{
  uint16_t uVar1;
  uint in_ESI;
  byte *in_RDI;
  uint32_t r;
  uint8_t *p;
  int local_24;
  uint32_t local_4;
  
  local_24 = 0;
  switch(in_ESI & 3) {
  case 0:
    local_4 = fetch32_le(in_RDI);
    break;
  case 1:
    local_4 = (uint32_t)*in_RDI;
    break;
  case 3:
    local_24 = (uint)in_RDI[2] << 0x10;
  case 2:
    uVar1 = fetch16_le(in_RDI);
    local_4 = local_24 + (uint)uVar1;
  }
  return local_4;
}

Assistant:

static __inline uint32_t tail32_le(const void *v, size_t tail) {
  const uint8_t *p = (const uint8_t *)v;
  uint32_t r = 0;
  switch (tail & 3) {
#if UNALIGNED_OK && __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  /* For most CPUs this code is better when not needed
   * copying for alignment or byte reordering. */
  case 0:
    return fetch32_le(p);
  case 3:
    r = (uint32_t)p[2] << 16;
  case 2:
    return r + fetch16_le(p);
  case 1:
    return p[0];
#else
  /* For most CPUs this code is better than a
   * copying for alignment and/or byte reordering. */
  case 0:
    r += p[3];
    r <<= 8;
  case 3:
    r += p[2];
    r <<= 8;
  case 2:
    r += p[1];
    r <<= 8;
  case 1:
    return r + p[0];
#endif
  }
  unreachable();
}